

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing.h
# Opt level: O2

void AssertEqual<HttpResult::Code,HttpResult::Code>
               (Code *actual,Code *expected,char *fileName,int lineNumber)

{
  ostream *poVar1;
  AssertionException *this;
  char *local_1d0;
  stringstream msg;
  ostream local_1a0 [376];
  
  if (*expected == *actual) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_1a0,"Equality assumption is broken: file \'");
  poVar1 = std::operator<<(poVar1,fileName);
  poVar1 = std::operator<<(poVar1,"\'; line ");
  std::ostream::operator<<((ostream *)poVar1,lineNumber);
  poVar1 = std::operator<<(local_1a0,"; Expected: ");
  operator<<(poVar1,*expected);
  poVar1 = std::operator<<(poVar1,"; Actual: ");
  operator<<(poVar1,*actual);
  this = (AssertionException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  AssertionException::AssertionException(this,local_1d0);
  __cxa_throw(this,&AssertionException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void AssertEqual(Actual&& actual, Expected&& expected, const char* fileName, int lineNumber)
{
    if (expected != actual)
    {
        std::stringstream msg;
        msg << "Equality assumption is broken: file '" << fileName << "'; line " << lineNumber;
        msg << "; Expected: " << expected << "; Actual: " << actual;
        throw AssertionException(msg.str().c_str());
    }
}